

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::BufferDescriptorCase::genResourceDeclarations_abi_cxx11_
          (string *__return_storage_ptr__,void *this,VkShaderStageFlagBits stage,int numUsedBindings
          )

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  ostringstream buf;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  uVar2 = *(int *)((long)this + 0x84) - 4;
  if (uVar2 < 5) {
    pcVar6 = &DAT_00b195a8 + *(int *)(&DAT_00b195a8 + (ulong)uVar2 * 4);
  }
  else {
    pcVar6 = "buffer";
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  iVar1 = *(int *)((long)this + 0x88);
  if (iVar1 == 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"layout(set = 0, binding = ",0x1a);
    poVar3 = (ostream *)std::ostream::operator<<(local_1a0,numUsedBindings);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", std140) ",10);
    sVar4 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," BufferName\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\thighp vec4 colorA;\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\thighp vec4 colorB;\n",0x14);
    lVar5 = 0x12;
    pcVar6 = "} b_instances[2];\n";
  }
  else if (iVar1 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"layout(set = 0, binding = ",0x1a);
    poVar3 = (ostream *)std::ostream::operator<<(local_1a0,numUsedBindings);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", std140) ",10);
    sVar4 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," BufferNameA\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\thighp vec4 colorA;\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\thighp vec4 colorB;\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"} b_instanceA;\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"layout(set = 0, binding = ",0x1a);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,numUsedBindings + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", std140) ",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," BufferNameB\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\thighp vec4 colorA;\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\thighp vec4 colorB;\n",0x14);
    lVar5 = 0xf;
    pcVar6 = "} b_instanceB;\n";
  }
  else {
    if (iVar1 != 0) goto LAB_00556122;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"layout(set = 0, binding = ",0x1a);
    poVar3 = (ostream *)std::ostream::operator<<(local_1a0,numUsedBindings);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", std140) ",10);
    sVar4 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," BufferName\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\thighp vec4 colorA;\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\thighp vec4 colorB;\n",0x14);
    lVar5 = 0xe;
    pcVar6 = "} b_instance;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar5);
LAB_00556122:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string BufferDescriptorCase::genResourceDeclarations (vk::VkShaderStageFlagBits stage, int numUsedBindings) const
{
	DE_UNREF(stage);

	const bool			isUniform		= isUniformDescriptorType(m_descriptorType);
	const char* const	storageType		= (isUniform) ? ("uniform") : ("buffer");
	std::ostringstream	buf;

	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			buf	<< "layout(set = 0, binding = " << (numUsedBindings) << ", std140) " << storageType << " BufferName\n"
				<< "{\n"
				<< "	highp vec4 colorA;\n"
				<< "	highp vec4 colorB;\n"
				<< "} b_instance;\n";
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			buf	<< "layout(set = 0, binding = " << (numUsedBindings) << ", std140) " << storageType << " BufferNameA\n"
				<< "{\n"
				<< "	highp vec4 colorA;\n"
				<< "	highp vec4 colorB;\n"
				<< "} b_instanceA;\n"
				<< "layout(set = 0, binding = " << (numUsedBindings+1) << ", std140) " << storageType << " BufferNameB\n"
				<< "{\n"
				<< "	highp vec4 colorA;\n"
				<< "	highp vec4 colorB;\n"
				<< "} b_instanceB;\n";
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			buf	<< "layout(set = 0, binding = " << (numUsedBindings) << ", std140) " << storageType << " BufferName\n"
				<< "{\n"
				<< "	highp vec4 colorA;\n"
				<< "	highp vec4 colorB;\n"
				<< "} b_instances[2];\n";
			break;

		default:
			DE_FATAL("Impossible");
	}

	return buf.str();
}